

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O1

bool __thiscall QPDF::parse_xrefFirst(QPDF *this,string *line,int *obj,int *num,int *bytes)

{
  byte bVar1;
  pointer pcVar2;
  int iVar3;
  bool bVar4;
  byte *pbVar5;
  long i;
  string obj_str;
  string num_str;
  char *local_70;
  ulong local_68;
  char local_60;
  undefined7 uStack_5f;
  char *local_50;
  ulong local_48;
  char local_40;
  undefined7 uStack_3f;
  
  pcVar2 = (line->_M_dataplus)._M_p;
  for (i = 0; (bVar1 = pcVar2[i], bVar1 - 9 < 5 || (bVar1 == 0x20)); i = i + 1) {
  }
  if (9 < (byte)(bVar1 - 0x30)) {
    return false;
  }
  local_70 = &local_60;
  local_68 = 0;
  local_60 = '\0';
  for (; bVar1 = pcVar2[i], (byte)(bVar1 - 0x30) < 10; i = i + 1) {
    std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
  }
  if ((bVar1 - 9 < 5) || (bVar1 == 0x20)) {
    for (; (bVar1 = pcVar2[i], bVar1 - 9 < 5 || (bVar1 == 0x20)); i = i + 1) {
    }
    if ((byte)(bVar1 - 0x30) < 10) {
      local_50 = &local_40;
      local_48 = 0;
      local_40 = '\0';
      for (pbVar5 = (byte *)(pcVar2 + i); (byte)(*pbVar5 - 0x30) < 10; pbVar5 = pbVar5 + 1) {
        i = i + 1;
        std::__cxx11::string::_M_replace_aux((ulong)&local_50,local_48,0,'\x01');
      }
      for (; (*pbVar5 - 9 < 5 || (*pbVar5 == 0x20)); pbVar5 = pbVar5 + 1) {
        i = i + 1;
      }
      if ((int)i != i) {
        QIntC::IntConverter<long,_int,_true,_true>::error(i);
      }
      *bytes = (int)i;
      iVar3 = QUtil::string_to_int(local_70);
      *obj = iVar3;
      iVar3 = QUtil::string_to_int(local_50);
      *num = iVar3;
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
      }
      bVar4 = true;
      goto LAB_0022a243;
    }
  }
  bVar4 = false;
LAB_0022a243:
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return bVar4;
}

Assistant:

bool
QPDF::parse_xrefFirst(std::string const& line, int& obj, int& num, int& bytes)
{
    // is_space and is_digit both return false on '\0', so this will not overrun the null-terminated
    // buffer.
    char const* p = line.c_str();
    char const* start = line.c_str();

    // Skip zero or more spaces
    while (util::is_space(*p)) {
        ++p;
    }
    // Require digit
    if (!util::is_digit(*p)) {
        return false;
    }
    // Gather digits
    std::string obj_str;
    while (util::is_digit(*p)) {
        obj_str.append(1, *p++);
    }
    // Require space
    if (!util::is_space(*p)) {
        return false;
    }
    // Skip spaces
    while (util::is_space(*p)) {
        ++p;
    }
    // Require digit
    if (!util::is_digit(*p)) {
        return false;
    }
    // Gather digits
    std::string num_str;
    while (util::is_digit(*p)) {
        num_str.append(1, *p++);
    }
    // Skip any space including line terminators
    while (util::is_space(*p)) {
        ++p;
    }
    bytes = toI(p - start);
    obj = QUtil::string_to_int(obj_str.c_str());
    num = QUtil::string_to_int(num_str.c_str());
    return true;
}